

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeNVT.cpp
# Opt level: O2

void __thiscall OpenMD::FluctuatingChargeNVT::moveB(FluctuatingChargeNVT *this)

{
  pointer ppAVar1;
  pointer pdVar2;
  DataStoragePointer DVar3;
  Snapshot *pSVar4;
  Molecule *pMVar5;
  pointer ppAVar6;
  Atom *pAVar7;
  long lVar8;
  int k;
  int iVar9;
  long lVar10;
  RealType RVar11;
  double dVar12;
  double dVar13;
  pair<double,_double> pVar14;
  MoleculeIterator i;
  double local_68;
  double local_58;
  double local_48;
  MoleculeIterator local_40;
  pair<double,_double> local_38;
  
  if ((this->super_FluctuatingChargePropagator).hasFlucQ_ == true) {
    local_40._M_node = (_Base_ptr)0x0;
    pVar14 = Snapshot::getElectronicThermostat(this->snap);
    pMVar5 = SimInfo::beginMolecule((this->super_FluctuatingChargePropagator).info_,&local_40);
    lVar10 = 0;
    while (local_68 = pVar14.first, pMVar5 != (Molecule *)0x0) {
      ppAVar6 = (pMVar5->fluctuatingCharges_).
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppAVar1 = (pMVar5->fluctuatingCharges_).
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppAVar6 == ppAVar1) {
        pAVar7 = (Atom *)0x0;
      }
      else {
        pAVar7 = *ppAVar6;
      }
      pdVar2 = (this->oldVel_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar10 = (long)(int)lVar10;
      while (ppAVar6 = ppAVar6 + 1, pAVar7 != (Atom *)0x0) {
        pdVar2[lVar10] =
             *(double *)
              (*(long *)((long)&(((pAVar7->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                atomData).flucQVel.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start +
                        (pAVar7->super_StuntDouble).storage_) +
              (long)(pAVar7->super_StuntDouble).localIndex_ * 8);
        if (ppAVar6 == ppAVar1) {
          pAVar7 = (Atom *)0x0;
        }
        else {
          pAVar7 = *ppAVar6;
        }
        lVar10 = lVar10 + 1;
      }
      pMVar5 = SimInfo::nextMolecule((this->super_FluctuatingChargePropagator).info_,&local_40);
    }
    iVar9 = 0;
    local_58 = local_68;
    do {
      local_38.first = local_58;
      if (this->maxIterNum_ <= iVar9) break;
      RVar11 = Thermo::getElectronicTemperature(&this->thermo);
      dVar12 = ((RVar11 / this->targetTemp_ + -1.0) * this->dt2_) /
               (this->tauThermostat_ * this->tauThermostat_) + local_68;
      pMVar5 = SimInfo::beginMolecule((this->super_FluctuatingChargePropagator).info_,&local_40);
      lVar10 = 0;
      while (pMVar5 != (Molecule *)0x0) {
        ppAVar6 = (pMVar5->fluctuatingCharges_).
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppAVar1 = (pMVar5->fluctuatingCharges_).
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if (ppAVar6 == ppAVar1) {
          pAVar7 = (Atom *)0x0;
        }
        else {
          pAVar7 = *ppAVar6;
        }
        pdVar2 = (this->oldVel_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar10 = (long)(int)lVar10;
        while (ppAVar6 = ppAVar6 + 1, pAVar7 != (Atom *)0x0) {
          DVar3 = (pAVar7->super_StuntDouble).storage_;
          pSVar4 = ((pAVar7->super_StuntDouble).snapshotMan_)->currentSnapshot_;
          lVar8 = (long)(pAVar7->super_StuntDouble).localIndex_;
          dVar13 = pdVar2[lVar10];
          *(double *)
           (*(long *)((long)&(pSVar4->atomData).flucQVel.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start + DVar3) + lVar8 * 8) =
               ((*(double *)
                  (*(long *)((long)&(pSVar4->atomData).flucQFrc.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start + DVar3) + lVar8 * 8) *
                this->dt2_) / pAVar7->chargeMass_ + dVar13) - this->dt2_ * dVar12 * dVar13;
          if (ppAVar6 == ppAVar1) {
            pAVar7 = (Atom *)0x0;
          }
          else {
            pAVar7 = *ppAVar6;
          }
          lVar10 = lVar10 + 1;
        }
        pMVar5 = SimInfo::nextMolecule((this->super_FluctuatingChargePropagator).info_,&local_40);
      }
      dVar13 = local_58 - dVar12;
      iVar9 = iVar9 + 1;
      local_58 = dVar12;
      local_38.first = dVar12;
    } while (this->chiTolerance_ < ABS(dVar13));
    local_48 = pVar14.second;
    local_38.second = this->dt2_ * local_38.first + local_48;
    Snapshot::setElectronicThermostat(this->snap,&local_38);
  }
  return;
}

Assistant:

void FluctuatingChargeNVT::moveB() {
    if (!hasFlucQ_) return;
    SimInfo::MoleculeIterator i;
    Molecule::FluctuatingChargeIterator j;
    Molecule* mol;
    Atom* atom;
    RealType instTemp;
    pair<RealType, RealType> thermostat = snap->getElectronicThermostat();
    RealType chi                        = thermostat.first;
    RealType oldChi                     = chi;
    RealType prevChi;
    RealType integralOfChidt = thermostat.second;
    int index;
    RealType cfrc, cvel, cmass;

    index = 0;
    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
           atom = mol->nextFluctuatingCharge(j)) {
        oldVel_[index] = atom->getFlucQVel();
        ++index;
      }
    }

    // do the iteration:

    for (int k = 0; k < maxIterNum_; k++) {
      index    = 0;
      instTemp = thermo.getElectronicTemperature();
      // evolve chi another half step using the temperature at t + dt/2
      prevChi = chi;
      chi     = oldChi + dt2_ * (instTemp / targetTemp_ - 1.0) /
                         (tauThermostat_ * tauThermostat_);

      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
             atom = mol->nextFluctuatingCharge(j)) {
          cfrc  = atom->getFlucQFrc();
          cmass = atom->getChargeMass();

          // velocity half step
          cvel = oldVel_[index] + dt2_ * cfrc / cmass -
                 dt2_ * chi * oldVel_[index];
          atom->setFlucQVel(cvel);
          ++index;
        }
      }
      if (fabs(prevChi - chi) <= chiTolerance_) break;
    }
    integralOfChidt += dt2_ * chi;
    snap->setElectronicThermostat(make_pair(chi, integralOfChidt));
  }